

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmToMont(octet *b,word *a,qr_o *r,void *stack)

{
  word *in_RCX;
  long in_RDX;
  word *in_RSI;
  word *c;
  word *dest;
  
  dest = in_RCX + *(long *)(in_RDX + 0x30) * 2;
  wwCopy(in_RCX,in_RSI,*(size_t *)(in_RDX + 0x30));
  wwSetZero(in_RCX + *(long *)(in_RDX + 0x30),*(size_t *)(in_RDX + 0x30));
  zzRedMont((word *)b,a,(size_t)r,(word)stack,c);
  u64To(dest,(size_t)in_RCX,(u64 *)0x16a8d9);
  return;
}

Assistant:

static void zmToMont(octet b[], const word a[], const qr_o* r, void* stack)
{
	word* c = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	stack = c + 2 * r->n;
	// c <- a * R^{-1} \mod mod
	wwCopy(c, a, r->n);
	wwSetZero(c + r->n, r->n);
	zzRedMont(c, r->mod, r->n, *(word*)r->params, stack);
	// b <- c
	wwTo(b, r->no, c);
}